

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordDouble *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  FILE *__stream;
  undefined8 uVar1;
  undefined8 uVar2;
  byte in_CL;
  long in_RDX;
  HighsLogOptions *in_RSI;
  FILE *in_RDI;
  int in_R8D;
  string line;
  string local_f0 [8];
  string *in_stack_ffffffffffffff18;
  string local_d0 [24];
  HighsInt in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  long local_18;
  HighsLogOptions *local_10;
  FILE *local_8;
  
  local_19 = in_CL & 1;
  if (((local_19 == 0) || (*(double *)(in_RDX + 0x70) != **(double **)(in_RDX + 0x58))) ||
     (NAN(*(double *)(in_RDX + 0x70)) || NAN(**(double **)(in_RDX + 0x58)))) {
    local_18 = in_RDX;
    if (in_R8D == 4) {
      std::__cxx11::string::string(local_60,(string *)(in_RDX + 0x10));
      highsInsertMdEscapes(in_stack_ffffffffffffff18);
      uVar1 = std::__cxx11::string::c_str();
      std::__cxx11::string::string(local_b0,(string *)(local_18 + 0x30));
      highsInsertMdEscapes(in_stack_ffffffffffffff18);
      uVar2 = std::__cxx11::string::c_str();
      fprintf(in_RDI,"## %s\n- %s\n- Type: double\n- Range: [%g, %g]\n- Default: %g\n\n",
              *(undefined8 *)(local_18 + 0x60),*(undefined8 *)(local_18 + 0x68),
              *(undefined8 *)(local_18 + 0x70),uVar1,uVar2);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
    }
    else {
      local_8 = in_RDI;
      if (in_R8D == 1) {
        uVar1 = std::__cxx11::string::c_str();
        fprintf(in_RDI,"\n# %s\n",uVar1);
        __stream = local_8;
        highsBoolToString_abi_cxx11_((bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48);
        uVar1 = std::__cxx11::string::c_str();
        fprintf(__stream,"# [type: double, advanced: %s, range: [%g, %g], default: %g]\n",
                *(undefined8 *)(local_18 + 0x60),*(undefined8 *)(local_18 + 0x68),
                *(undefined8 *)(local_18 + 0x70),uVar1);
        std::__cxx11::string::~string(local_d0);
        uVar1 = std::__cxx11::string::c_str();
        fprintf(local_8,"%s = %g\n",**(undefined8 **)(local_18 + 0x58),uVar1);
      }
      else {
        local_10 = in_RSI;
        uVar1 = std::__cxx11::string::c_str();
        highsFormatToString_abi_cxx11_
                  ((char *)**(undefined8 **)(local_18 + 0x58),local_f0,"Set option %s to %g\n",uVar1
                  );
        if (local_8 == _stdout) {
          uVar1 = std::__cxx11::string::c_str();
          highsLogUser(local_10,kInfo,"%s",uVar1);
        }
        else {
          uVar1 = std::__cxx11::string::c_str();
          fprintf(local_8,"%s",uVar1);
        }
        std::__cxx11::string::~string(local_f0);
      }
    }
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordDouble& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(
          file,
          "## %s\n- %s\n- Type: double\n- Range: [%g, %g]\n- Default: %g\n\n",
          highsInsertMdEscapes(option.name).c_str(),
          highsInsertMdEscapes(option.description).c_str(), option.lower_bound,
          option.upper_bound, option.default_value);
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file,
              "# [type: double, advanced: %s, range: [%g, %g], default: %g]\n",
              highsBoolToString(option.advanced).c_str(), option.lower_bound,
              option.upper_bound, option.default_value);
      fprintf(file, "%s = %g\n", option.name.c_str(), *option.value);
    } else {
      std::string line = highsFormatToString(
          "Set option %s to %g\n", option.name.c_str(), *option.value);
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}